

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.h
# Opt level: O2

ostream * std::operator<<(ostream *os,vector<unsigned_int,_std::allocator<unsigned_int>_> *vec)

{
  pointer puVar1;
  ostream *poVar2;
  uint *item;
  pointer puVar3;
  
  puVar1 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar3 = (vec->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::operator<<(poVar2,", ");
  }
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const std::vector<T>& vec)
{
  for (auto const& item : vec)
  {
    os << item << ", ";
  }
  return os;
}